

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_file_format.cc
# Opt level: O2

InputGraph read_file_format(string *format,string *filename)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  GraphFileError *pGVar4;
  string *in_RDX;
  string actual_format;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream infile;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&infile,(string *)in_RDX,_S_in);
  if ((abStack_218[*(long *)(_infile + -0x18)] & 5) != 0) {
    pGVar4 = (GraphFileError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&actual_format,"unable to open file",(allocator<char> *)&local_278);
    GraphFileError::GraphFileError(pGVar4,in_RDX,&actual_format,false);
    __cxa_throw(pGVar4,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
  }
  std::__cxx11::string::string((string *)&actual_format,filename);
  bVar1 = std::operator==(&actual_format,"auto");
  if (bVar1) {
    detect_format(&local_278,&infile,in_RDX);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&actual_format,&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::ios::clear((int)&infile + (int)*(undefined8 *)(_infile + -0x18));
    plVar3 = (long *)std::istream::seekg((long)&infile,_S_beg);
    if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) {
      pGVar4 = (GraphFileError *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_278,
                 "unable to seek on input file (try specifying file format explicitly)",
                 (allocator<char> *)&local_258);
      GraphFileError::GraphFileError(pGVar4,in_RDX,&local_278,true);
      __cxa_throw(pGVar4,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
    }
  }
  bVar1 = std::operator==(&actual_format,"dimacs");
  if (bVar1) {
    read_dimacs((ifstream *)format,(string *)&infile);
  }
  else {
    bVar1 = std::operator==(&actual_format,"lad");
    if (bVar1) {
      read_lad((ifstream *)format,(string *)&infile);
    }
    else {
      bVar1 = std::operator==(&actual_format,"directedlad");
      if (bVar1) {
        read_directed_lad((ifstream *)format,(string *)&infile);
      }
      else {
        bVar1 = std::operator==(&actual_format,"labelledlad");
        if (bVar1) {
          read_labelled_lad((ifstream *)format,(string *)&infile);
        }
        else {
          bVar1 = std::operator==(&actual_format,"vertexlabelledlad");
          if (bVar1) {
            read_vertex_labelled_lad((ifstream *)format,(string *)&infile);
          }
          else {
            bVar1 = std::operator==(&actual_format,"csv");
            if (bVar1) {
              read_csv((istream *)format,(string *)&infile);
            }
            else {
              bVar1 = std::operator==(&actual_format,"vfmcs");
              if (bVar1) {
                read_unlabelled_undirected_vfmcs((ifstream *)format,(string *)&infile);
              }
              else {
                bVar1 = std::operator==(&actual_format,"vfmcsv");
                if (bVar1) {
                  read_vertex_labelled_undirected_vfmcs((ifstream *)format,(string *)&infile);
                }
                else {
                  bVar1 = std::operator==(&actual_format,"vfmcsvd");
                  if (bVar1) {
                    read_vertex_labelled_directed_vfmcs((ifstream *)format,(string *)&infile);
                  }
                  else {
                    iVar2 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            compare(&actual_format,0,8,"csvname:");
                    if (iVar2 != 0) {
                      pGVar4 = (GraphFileError *)__cxa_allocate_exception(0x30);
                      std::operator+(&local_258,"Unknown file format \'",filename);
                      std::operator+(&local_278,&local_258,"\'");
                      GraphFileError::GraphFileError(pGVar4,in_RDX,&local_278,true);
                      __cxa_throw(pGVar4,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
                    }
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::substr(&local_278,&actual_format,8,0xffffffffffffffff);
                    read_csv_name((istream *)format,(string *)&infile,in_RDX);
                    std::__cxx11::string::~string((string *)&local_278);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&actual_format);
  std::ifstream::~ifstream(&infile);
  return (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)
         (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)format;
}

Assistant:

auto read_file_format(const string & format, const string & filename) -> InputGraph
{
    ifstream infile{filename};
    if (! infile)
        throw GraphFileError{filename, "unable to open file", false};

    auto actual_format = format;
    if (actual_format == "auto") {
        actual_format = detect_format(infile, filename);
        infile.clear();
        if (! infile.seekg(0, ios::beg))
            throw GraphFileError{filename, "unable to seek on input file (try specifying file format explicitly)", true};
    }

    if (actual_format == "dimacs")
        return read_dimacs(move(infile), filename);
    else if (actual_format == "lad")
        return read_lad(move(infile), filename);
    else if (actual_format == "directedlad")
        return read_directed_lad(move(infile), filename);
    else if (actual_format == "labelledlad")
        return read_labelled_lad(move(infile), filename);
    else if (actual_format == "vertexlabelledlad")
        return read_vertex_labelled_lad(move(infile), filename);
    else if (actual_format == "csv")
        return read_csv(move(infile), filename);
    else if (actual_format == "vfmcs")
        return read_unlabelled_undirected_vfmcs(move(infile), filename);
    else if (actual_format == "vfmcsv")
        return read_vertex_labelled_undirected_vfmcs(move(infile), filename);
    else if (actual_format == "vfmcsvd")
        return read_vertex_labelled_directed_vfmcs(move(infile), filename);
    else if (0 == actual_format.compare(0, 8, "csvname:"))
        return read_csv_name(move(infile), filename, actual_format.substr(8));
    else
        throw GraphFileError{filename, "Unknown file format '" + format + "'", true};
}